

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::anon_unknown_19::FieldIndexSorter::operator()
          (FieldIndexSorter *this,FieldDescriptor *left,FieldDescriptor *right)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  int __c;
  FieldDescriptor *__s;
  bool bVar4;
  
  if (this[0x42] == (FieldIndexSorter)0x1) {
    if (left[0x42] == (FieldDescriptor)0x0) {
      return false;
    }
    bVar4 = SBORROW4(*(int *)(this + 0x44),*(int *)(left + 0x44));
    iVar1 = *(int *)(this + 0x44) - *(int *)(left + 0x44);
  }
  else {
    if (left[0x42] != (FieldDescriptor)0x0) {
      return true;
    }
    __s = left;
    pcVar2 = FieldDescriptor::index((FieldDescriptor *)this,(char *)left,(int)right);
    pcVar3 = FieldDescriptor::index(left,(char *)__s,__c);
    bVar4 = SBORROW4((int)pcVar2,(int)pcVar3);
    iVar1 = (int)pcVar2 - (int)pcVar3;
  }
  return bVar4 != iVar1 < 0;
}

Assistant:

bool operator()(const FieldDescriptor* left,
                  const FieldDescriptor* right) const {
    if (left->is_extension() && right->is_extension()) {
      return left->number() < right->number();
    } else if (left->is_extension()) {
      return false;
    } else if (right->is_extension()) {
      return true;
    } else {
      return left->index() < right->index();
    }
  }